

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint _h;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  float *pfVar10;
  void *pvVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  void *pvVar15;
  void *pvVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  void *pvVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  ulong local_b0;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar12 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar12;
  }
  iVar12 = this->num_output;
  uVar2 = bottom_blob->w;
  _h = bottom_blob->h;
  uVar3 = bottom_blob->c;
  if ((bottom_blob->dims == 2) && (1 < (int)_h && uVar2 == this->weight_data_size / iVar12)) {
    Mat::create(top_blob,iVar12,_h,bottom_blob->elemsize,opt->blob_allocator);
    pvVar6 = top_blob->data;
    if (pvVar6 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    pvVar20 = bottom_blob->data;
    iVar12 = bottom_blob->w;
    iVar4 = top_blob->w;
    sVar7 = top_blob->elemsize;
    uVar3 = this->num_output;
    iVar5 = this->bias_term;
    pvVar8 = (this->weight_data).data;
    iVar13 = this->activation_type;
    sVar9 = bottom_blob->elemsize;
    local_b0 = 0;
    do {
      if (0 < (int)uVar3) {
        pfVar10 = (float *)(this->activation_params).data;
        pvVar11 = (this->bias_data).data;
        uVar17 = 0;
        pvVar16 = pvVar8;
        do {
          if (iVar5 == 0) {
            fVar23 = 0.0;
          }
          else {
            fVar23 = *(float *)((long)pvVar11 + uVar17 * 4);
          }
          if (0 < (int)uVar2) {
            uVar14 = 0;
            do {
              fVar23 = fVar23 + *(float *)((long)pvVar16 + uVar14 * 4) *
                                *(float *)((long)pvVar20 + uVar14 * 4);
              uVar14 = uVar14 + 1;
            } while (uVar2 != uVar14);
          }
          fVar21 = fVar23;
          switch(iVar13) {
          case 1:
            if (fVar23 <= 0.0) {
              fVar21 = 0.0;
            }
            break;
          case 2:
            fVar21 = (float)(~-(uint)(0.0 < fVar23) & (uint)*pfVar10 |
                            -(uint)(0.0 < fVar23) & 0x3f800000) * fVar23;
            break;
          case 3:
            if (fVar23 <= *pfVar10) {
              fVar23 = *pfVar10;
            }
            fVar21 = pfVar10[1];
            if (fVar23 <= pfVar10[1]) {
              fVar21 = fVar23;
            }
            break;
          case 4:
            if (88.37626 <= fVar23) {
              fVar23 = 88.37626;
            }
            fVar23 = expf((float)(-(uint)(fVar23 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar23 < -88.37626) & (uint)-fVar23));
            fVar21 = 1.0 / (fVar23 + 1.0);
            break;
          case 5:
            fVar21 = expf(fVar23);
            fVar21 = logf(fVar21 + 1.0);
            fVar21 = tanhf(fVar21);
            fVar21 = fVar21 * fVar23;
            break;
          case 6:
            fVar1 = *pfVar10;
            fVar22 = -pfVar10[1] / fVar1;
            fVar21 = 0.0;
            if ((fVar22 <= fVar23) && (fVar21 = fVar23, fVar23 <= fVar22 + 1.0 / fVar1)) {
              fVar21 = (fVar1 * fVar23 + pfVar10[1]) * fVar23;
            }
          }
          *(float *)((long)pvVar6 + uVar17 * 4 + (long)iVar4 * sVar7 * local_b0) = fVar21;
          uVar17 = uVar17 + 1;
          pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar2 * 4);
        } while (uVar17 != uVar3);
      }
      local_b0 = local_b0 + 1;
      pvVar20 = (void *)((long)pvVar20 + (long)iVar12 * sVar9);
    } while (local_b0 != _h);
  }
  else {
    Mat::create(top_blob,iVar12,bottom_blob->elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    iVar12 = this->num_output;
    if (0 < (long)iVar12) {
      uVar19 = _h * uVar2;
      iVar4 = this->bias_term;
      iVar5 = this->activation_type;
      pvVar6 = (this->bias_data).data;
      pvVar20 = (this->weight_data).data;
      pvVar8 = bottom_blob->data;
      sVar7 = bottom_blob->cstep;
      pfVar10 = (float *)(this->activation_params).data;
      pvVar11 = top_blob->data;
      sVar9 = bottom_blob->elemsize;
      iVar13 = 0;
      lVar18 = 0;
      do {
        fVar23 = 0.0;
        if (iVar4 != 0) {
          fVar23 = *(float *)((long)pvVar6 + lVar18 * 4);
        }
        if (0 < (int)uVar3) {
          pvVar16 = (void *)((long)pvVar20 + (long)iVar13 * 4);
          uVar17 = 0;
          pvVar15 = pvVar8;
          do {
            if (0 < (int)uVar19) {
              uVar14 = 0;
              do {
                fVar23 = fVar23 + *(float *)((long)pvVar16 + uVar14 * 4) *
                                  *(float *)((long)pvVar15 + uVar14 * 4);
                uVar14 = uVar14 + 1;
              } while (uVar19 != uVar14);
            }
            uVar17 = uVar17 + 1;
            pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar19 * 4);
            pvVar15 = (void *)((long)pvVar15 + sVar7 * sVar9);
          } while (uVar17 != uVar3);
        }
        fVar21 = fVar23;
        switch(iVar5) {
        case 1:
          if (fVar23 <= 0.0) {
            fVar21 = 0.0;
          }
          break;
        case 2:
          fVar21 = (float)(~-(uint)(0.0 < fVar23) & (uint)*pfVar10 |
                          -(uint)(0.0 < fVar23) & 0x3f800000) * fVar23;
          break;
        case 3:
          if (fVar23 <= *pfVar10) {
            fVar23 = *pfVar10;
          }
          fVar21 = pfVar10[1];
          if (fVar23 <= pfVar10[1]) {
            fVar21 = fVar23;
          }
          break;
        case 4:
          if (88.37626 <= fVar23) {
            fVar23 = 88.37626;
          }
          fVar23 = expf((float)(-(uint)(fVar23 < -88.37626) & 0x42b0c0a5 |
                               ~-(uint)(fVar23 < -88.37626) & (uint)-fVar23));
          fVar21 = 1.0 / (fVar23 + 1.0);
          break;
        case 5:
          fVar21 = expf(fVar23);
          fVar21 = logf(fVar21 + 1.0);
          fVar21 = tanhf(fVar21);
          fVar21 = fVar21 * fVar23;
          break;
        case 6:
          fVar1 = *pfVar10;
          fVar22 = -pfVar10[1] / fVar1;
          fVar21 = 0.0;
          if ((fVar22 <= fVar23) && (fVar21 = fVar23, fVar23 <= fVar22 + 1.0 / fVar1)) {
            fVar21 = (fVar1 * fVar23 + pfVar10[1]) * fVar23;
          }
        }
        *(float *)((long)pvVar11 + lVar18 * 4) = fVar21;
        lVar18 = lVar18 + 1;
        iVar13 = iVar13 + _h * uVar3 * uVar2;
      } while (lVar18 != iVar12);
    }
  }
  return 0;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    if (bottom_blob.dims == 2 && w == num_input && h > 1)
    {
        // gemm
        top_blob.create(num_output, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* m = bottom_blob.row(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const float* kptr = (const float*)weight_data + w * p;

                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }

                outptr[p] = activation_ss(sum, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q = 0; q < channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        top_blob[p] = activation_ss(sum, activation_type, activation_params);
    }

    return 0;
}